

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::removeUnreferencedResources(Config *this,string *parameter)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  bVar1 = std::operator==(parameter,"auto");
  if (bVar1) {
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    remove_unreferenced_page_resources = re_auto;
  }
  else {
    bVar1 = std::operator==(parameter,"yes");
    if (bVar1) {
      ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      remove_unreferenced_page_resources = re_yes;
    }
    else {
      bVar1 = std::operator==(parameter,"no");
      if (bVar1) {
        ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        remove_unreferenced_page_resources = re_no;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"invalid value for --remove-unreferenced-page-resources",
                   &local_31);
        usage(&local_30);
        std::__cxx11::string::~string((string *)&local_30);
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::removeUnreferencedResources(std::string const& parameter)
{
    if (parameter == "auto") {
        o.m->remove_unreferenced_page_resources = QPDFJob::re_auto;
    } else if (parameter == "yes") {
        o.m->remove_unreferenced_page_resources = QPDFJob::re_yes;
    } else if (parameter == "no") {
        o.m->remove_unreferenced_page_resources = QPDFJob::re_no;
    } else {
        usage("invalid value for --remove-unreferenced-page-resources");
    }
    return this;
}